

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::traverseUnique
          (TraverseSchema *this,DOMElement *icElem,SchemaElementDecl *elemDecl)

{
  bool bVar1;
  XMLCh *src;
  XMLSize_t count;
  RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher> *this_00;
  IdentityConstraint *valueToAdopt;
  NamespaceScopeManager nsMgr;
  
  NamespaceScopeManager::NamespaceScopeManager(&nsMgr,icElem,this->fSchemaInfo,this);
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,icElem,0x30,this,false,this->fNonXSAttList);
  src = getElementAttValue(this,icElem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  count = XMLString::stringLen(src);
  bVar1 = XMLChar1_0::isValidNCName(src,count);
  if (bVar1) {
    if (this->fIdentityConstraintNames ==
        (RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher> *)0x0) {
      this_00 = (RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher> *)
                XMemory::operator_new(0x30,this->fGrammarPoolMemoryManager);
      RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::
      RefHash2KeysTableOf(this_00,0x1d,false,this->fGrammarPoolMemoryManager);
      this->fIdentityConstraintNames = this_00;
    }
    else {
      bVar1 = RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::
              containsKey(this->fIdentityConstraintNames,src,this->fTargetNSURI);
      if (bVar1) {
        reportSchemaError(this,icElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x82,src,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
        goto LAB_0031dbfa;
      }
    }
    valueToAdopt = (IdentityConstraint *)XMemory::operator_new(0x38,this->fGrammarPoolMemoryManager)
    ;
    IC_Unique::IC_Unique
              ((IC_Unique *)valueToAdopt,src,
               ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,
               this->fGrammarPoolMemoryManager);
    RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::put
              (this->fIdentityConstraintNames,src,this->fTargetNSURI,valueToAdopt);
    bVar1 = traverseIdentityConstraint(this,valueToAdopt,icElem);
    if (bVar1) {
      SchemaElementDecl::addIdentityConstraint(elemDecl,valueToAdopt);
      valueToAdopt->fNamespaceURI = this->fTargetNSURI;
    }
    else {
      RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::put
                (this->fIdentityConstraintNames,src,this->fTargetNSURI,(IdentityConstraint *)0x0);
      (*(valueToAdopt->super_XSerializable)._vptr_XSerializable[1])(valueToAdopt);
    }
  }
  else {
    reportSchemaError(this,icElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x35,
                      (XMLCh *)SchemaSymbols::fgELT_UNIQUE,src,(XMLCh *)0x0,(XMLCh *)0x0);
  }
LAB_0031dbfa:
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return;
}

Assistant:

void TraverseSchema::traverseUnique(const DOMElement* const icElem,
                                    SchemaElementDecl* const elemDecl) {

    NamespaceScopeManager nsMgr(icElem, fSchemaInfo, this);

    // -----------------------------------------------------------------------
    // Check Attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        icElem, GeneralAttributeCheck::E_Unique, this, false, fNonXSAttList
    );

    // -----------------------------------------------------------------------
    // Create identity constraint
    // -----------------------------------------------------------------------
    const XMLCh* name = getElementAttValue(icElem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name))) {
        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName,
                          SchemaSymbols::fgELT_UNIQUE, name);
        return;
    }

    if (!fIdentityConstraintNames) {
        fIdentityConstraintNames = new (fGrammarPoolMemoryManager) RefHash2KeysTableOf<IdentityConstraint>(29, (bool) false, fGrammarPoolMemoryManager);
    }
    else if (fIdentityConstraintNames->containsKey(name, fTargetNSURI)) {

        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::IC_DuplicateDecl, name);
        return;
    }

    IC_Unique* icUnique = new (fGrammarPoolMemoryManager) IC_Unique(name, elemDecl->getBaseName(), fGrammarPoolMemoryManager);
    Janitor<IC_Unique> janUnique(icUnique);

    fIdentityConstraintNames->put((void*) name, fTargetNSURI, icUnique);

    // -----------------------------------------------------------------------
    // Get selector and fields
    // -----------------------------------------------------------------------
    if (!traverseIdentityConstraint(icUnique, icElem)) {

        fIdentityConstraintNames->put((void*) name, fTargetNSURI, 0);
        return;
    }

    // -----------------------------------------------------------------------
    // Add identity cosntraints to element declaration
    // -----------------------------------------------------------------------
    elemDecl->addIdentityConstraint(icUnique);
    icUnique->setNamespaceURI(fTargetNSURI);
    janUnique.orphan();
}